

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O3

string_view __thiscall
bloaty::dwarf::CompilationUnitSizes::ReadInitialLength
          (CompilationUnitSizes *this,string_view *remaining)

{
  ulong uVar1;
  uint *puVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  size_type __rlen;
  string_view sVar6;
  
  uVar1 = remaining->_M_len;
  if (3 < uVar1) {
    puVar2 = (uint *)remaining->_M_str;
    uVar4 = (ulong)*puVar2;
    uVar5 = uVar1 - 4;
    remaining->_M_str = (char *)(puVar2 + 1);
    remaining->_M_len = uVar5;
    if (uVar4 == 0xffffffff) {
      this->dwarf64_ = true;
      if (uVar5 < 8) goto LAB_001aa40a;
      uVar4 = *(ulong *)(puVar2 + 1);
      remaining->_M_str = (char *)(puVar2 + 3);
      uVar5 = uVar1 - 0xc;
      remaining->_M_len = uVar5;
    }
    else {
      this->dwarf64_ = false;
    }
    if (uVar4 <= uVar5) {
      pcVar3 = remaining->_M_str;
      remaining->_M_len = uVar5 - uVar4;
      remaining->_M_str = pcVar3 + uVar4;
      sVar6._M_str = pcVar3;
      sVar6._M_len = uVar4;
      return sVar6;
    }
    Throw("short DWARF compilation unit",0x59);
  }
LAB_001aa40a:
  Throw("premature EOF reading fixed-length data",0x8d);
}

Assistant:

std::string_view CompilationUnitSizes::ReadInitialLength(
    std::string_view* remaining) {
  uint64_t len = ReadFixed<uint32_t>(remaining);

  if (len == 0xffffffff) {
    dwarf64_ = true;
    len = ReadFixed<uint64_t>(remaining);
  } else {
    dwarf64_ = false;
  }

  if (remaining->size() < len) {
    THROW("short DWARF compilation unit");
  }

  std::string_view unit = *remaining;
  unit.remove_suffix(remaining->size() - len);
  *remaining = remaining->substr(len);
  return unit;
}